

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int auxgetstr(lua_State *L,TValue *t,char *k)

{
  StkId pTVar1;
  TString *key;
  TString *x_;
  TValue *io;
  TValue *io1;
  TString *str;
  TValue *slot;
  char *k_local;
  TValue *t_local;
  lua_State *L_local;
  
  key = luaS_new(L,k);
  if (t->tt_ == 0x45) {
    str = (TString *)luaH_getstr((Table *)(t->value_).gc,key);
    if (*(int *)&str->tt != 0) {
      pTVar1 = L->top;
      pTVar1->value_ = *(Value *)&str->next;
      *(undefined8 *)&pTVar1->tt_ = *(undefined8 *)&str->tt;
      L->top = L->top + 1;
      goto LAB_00105cc4;
    }
  }
  else {
    str = (TString *)0x0;
  }
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)key;
  pTVar1->tt_ = key->tt | 0x40;
  L->top = L->top + 1;
  luaV_finishget(L,t,L->top + -1,L->top + -1,(TValue *)str);
LAB_00105cc4:
  return L->top[-1].tt_ & 0xf;
}

Assistant:

static int auxgetstr (lua_State *L, const TValue *t, const char *k) {
  const TValue *slot;
  TString *str = luaS_new(L, k);
  if (luaV_fastget(L, t, str, slot, luaH_getstr)) {
    setobj2s(L, L->top, slot);
    api_incr_top(L);
  }
  else {
    setsvalue2s(L, L->top, str);
    api_incr_top(L);
    luaV_finishget(L, t, L->top - 1, L->top - 1, slot);
  }
  lua_unlock(L);
  return ttnov(L->top - 1);
}